

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_scroll_area.cxx
# Opt level: O0

void fl_scroll(int X,int Y,int W,int H,int dx,int dy,_func_void_void_ptr_int_int_int_int *draw_area,
              void *data)

{
  int local_110 [2];
  XEvent e;
  int clip_h;
  int clip_y;
  int dest_y;
  int src_h;
  int src_y;
  int clip_w;
  int clip_x;
  int dest_x;
  int src_w;
  int src_x;
  int dy_local;
  int dx_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  
  if ((dx != 0) || (dy != 0)) {
    src_w = dy;
    src_x = dx;
    dy_local = H;
    dx_local = W;
    H_local = Y;
    W_local = X;
    if ((dx == -W || SBORROW4(dx,-W) != dx + W < 0) || (((W <= dx || (dy <= -H)) || (H <= dy)))) {
      (*draw_area)(data,X,Y,W,H);
    }
    else {
      if (dx < 1) {
        dest_x = X - dx;
        clip_x = W + dx;
        src_y = X + clip_x;
        src_h = W - clip_x;
        clip_w = X;
      }
      else {
        clip_w = X + dx;
        clip_x = W - dx;
        src_h = dx;
        src_y = X;
        dest_x = X;
      }
      if (dy < 1) {
        dest_y = Y - dy;
        clip_y = H + dy;
        e.pad[0x17]._4_4_ = Y + clip_y;
        e.pad[0x17]._0_4_ = H - clip_y;
        clip_h = Y;
      }
      else {
        clip_h = Y + dy;
        clip_y = H - dy;
        e.pad[0x17]._0_4_ = dy;
        e.pad[0x17]._4_4_ = Y;
        dest_y = Y;
      }
      XCopyArea(fl_display,fl_window,fl_window,fl_gc,dest_x,dest_y,clip_x,clip_y,clip_w,clip_h);
      do {
        XWindowEvent(fl_display,fl_window,0x8000,local_110);
        if (local_110[0] == 0xe) break;
        (*draw_area)(data,e.xgeneric.extension,e.xgeneric.evtype,e.xfocus.mode,e.xfocus.detail);
      } while (e.xexpose.width != 0);
      if (src_x != 0) {
        (*draw_area)(data,src_y,clip_h,src_h,clip_y);
      }
      if (src_w != 0) {
        (*draw_area)(data,W_local,e.pad[0x17]._4_4_,dx_local,e.pad[0x17]._0_4_);
      }
    }
  }
  return;
}

Assistant:

void fl_scroll(int X, int Y, int W, int H, int dx, int dy,
               void (*draw_area)(void*, int,int,int,int), void* data)
{
  if (!dx && !dy) return;
  if (dx <= -W || dx >= W || dy <= -H || dy >= H) {
    // no intersection of old an new scroll
    draw_area(data,X,Y,W,H);
    return;
  }
  int src_x, src_w, dest_x, clip_x, clip_w;
  if (dx > 0) {
    src_x = X;
    dest_x = X+dx;
    src_w = W-dx;
    clip_x = X;
    clip_w = dx;
  } else {
    src_x = X-dx;
    dest_x = X;
    src_w = W+dx;
    clip_x = X+src_w;
    clip_w = W-src_w;
  }
  int src_y, src_h, dest_y, clip_y, clip_h;
  if (dy > 0) {
    src_y = Y;
    dest_y = Y+dy;
    src_h = H-dy;
    clip_y = Y;
    clip_h = dy;
  } else {
    src_y = Y-dy;
    dest_y = Y;
    src_h = H+dy;
    clip_y = Y+src_h;
    clip_h = H-src_h;
  }

#if defined(USE_X11)
  XCopyArea(fl_display, fl_window, fl_window, fl_gc,
	    src_x, src_y, src_w, src_h, dest_x, dest_y);
  // we have to sync the display and get the GraphicsExpose events! (sigh)
  for (;;) {
    XEvent e; XWindowEvent(fl_display, fl_window, ExposureMask, &e);
    if (e.type == NoExpose) break;
    // otherwise assume it is a GraphicsExpose event:
    draw_area(data, e.xexpose.x, e.xexpose.y,
	      e.xexpose.width, e.xexpose.height);
    if (!e.xgraphicsexpose.count) break;
  }
#elif defined(WIN32)
  typedef int (WINAPI* fl_GetRandomRgn_func)(HDC, HRGN, INT);
  static fl_GetRandomRgn_func fl_GetRandomRgn = 0L;
  static char first_time = 1;

  // We will have to do some Region magic now, so let's see if the 
  // required function is available (and it should be staring w/Win95)
  if (first_time) {
    HMODULE hMod = GetModuleHandle("GDI32.DLL");
    if (hMod) {
      fl_GetRandomRgn = (fl_GetRandomRgn_func)GetProcAddress(hMod, "GetRandomRgn");
    }
    first_time = 0;
  }

  // Now check if the source scrolling area is fully visible.
  // If it is, we will do a quick scroll and just update the 
  // newly exposed area. If it is not, we go the safe route and 
  // re-render the full area instead.
  // Note 1: we could go and find the areas that are actually
  // obscured and recursively call fl_scroll for the newly found
  // rectangles. However, this practice would rely on the 
  // elements of the undocumented Rgn structure.
  // Note 2: although this method should take care of most 
  // multi-screen solutions, it will not solve issues scrolling
  // from a different resolution screen onto another.
  // Note 3: this has been tested with image maps, too.
  if (fl_GetRandomRgn) {
    // get the DC region minus all overlapping windows
    HRGN sys_rgn = CreateRectRgn(0, 0, 0, 0);
    fl_GetRandomRgn(fl_gc, sys_rgn, 4);
    // now get the source scrolling rectangle 
    HRGN src_rgn = CreateRectRgn(src_x, src_y, src_x+src_w, src_y+src_h);
    POINT offset = { 0, 0 };
    if (GetDCOrgEx(fl_gc, &offset)) {
      OffsetRgn(src_rgn, offset.x, offset.y);
    }
    // see if all source pixels are available in the system region
    // Note: we could be a bit more merciful and subtract the 
    // scroll destination region as well.
    HRGN dst_rgn = CreateRectRgn(0, 0, 0, 0);
    int r = CombineRgn(dst_rgn, src_rgn, sys_rgn, RGN_DIFF);
    DeleteObject(dst_rgn);
    DeleteObject(src_rgn);
    DeleteObject(sys_rgn);
    if (r!=NULLREGION) {
      draw_area(data,X,Y,W,H);
      return;
    }
  }

  // Great, we can do an accelerated scroll instead of re-rendering
  BitBlt(fl_gc, dest_x, dest_y, src_w, src_h, fl_gc, src_x, src_y,SRCCOPY);

#elif defined(__APPLE_QUARTZ__)
  CGImageRef img = Fl_X::CGImage_from_window_rect(Fl_Window::current(), src_x, src_y, src_w, src_h);
  if (img) {
    CGRect rect = CGRectMake(dest_x, dest_y, src_w, src_h);
    Fl_X::q_begin_image(rect, 0, 0, src_w, src_h);
    CGContextDrawImage(fl_gc, rect, img);
    Fl_X::q_end_image();
    CFRelease(img);
    }
#else
# error unsupported platform
#endif
  if (dx) draw_area(data, clip_x, dest_y, clip_w, src_h);
  if (dy) draw_area(data, X, clip_y, W, clip_h);
}